

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O3

void __thiscall
AomLeb128_FixedSizeEncodeTest_Test::TestBody(AomLeb128_FixedSizeEncodeTest_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  ulong uVar3;
  size_t bytes_written;
  uint8_t write_buffer [4];
  uint8_t expected_bytes [4];
  size_t kWriteBufferSize;
  AssertHelper local_60;
  Message local_58;
  internal local_50 [8];
  undefined8 *local_48;
  size_t local_40;
  uint8_t local_38 [4];
  uchar local_34 [4];
  unsigned_long local_30;
  
  local_34[0] = 0xa3;
  local_34[1] = 0x82;
  local_34[2] = 0x80;
  local_34[3] = '\0';
  local_30 = 4;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_40 = 0;
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_60.data_._0_4_ = aom_uleb_encode_fixed_size(0x123,4,4,local_38,&local_40);
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"0",
             "aom_uleb_encode_fixed_size(test_value, kWriteBufferSize, kWriteBufferSize, &write_buffer[0], &bytes_written)"
             ,(int *)&local_58,(int *)&local_60);
  puVar1 = local_48;
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_48 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
               ,0x59,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
  }
  else {
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_50,"kWriteBufferSize","bytes_written",&local_30,&local_40);
    puVar1 = local_48;
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message(&local_58);
      if (local_48 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x5a,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
    }
    else {
      if (local_48 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_48 != local_48 + 2) {
          operator_delete((undefined8 *)*local_48);
        }
        operator_delete(puVar1);
      }
      if (local_40 == 0) {
        return;
      }
      uVar3 = 0;
      while (testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                       (local_50,"write_buffer[i]","expected_bytes[i]",local_38 + uVar3,
                        local_34 + uVar3), puVar1 = local_48, local_50[0] != (internal)0x0) {
        if (local_48 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_48 != local_48 + 2) {
            operator_delete((undefined8 *)*local_48);
          }
          operator_delete(puVar1);
        }
        uVar3 = uVar3 + 1;
        if (local_40 <= uVar3) {
          return;
        }
      }
      testing::Message::Message(&local_58);
      if (local_48 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x5c,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((long *)CONCAT44(local_58.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_58.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_58.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_58.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(local_48);
  }
  return;
}

Assistant:

TEST(AomLeb128, FixedSizeEncodeTest) {
  const uint32_t test_value = 0x123;
  const uint8_t expected_bytes[4] = { 0xa3, 0x82, 0x80, 0x00 };
  const size_t kWriteBufferSize = 4;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t bytes_written = 0;
  ASSERT_EQ(0, aom_uleb_encode_fixed_size(test_value, kWriteBufferSize,
                                          kWriteBufferSize, &write_buffer[0],
                                          &bytes_written));
  ASSERT_EQ(kWriteBufferSize, bytes_written);
  for (size_t i = 0; i < bytes_written; ++i) {
    ASSERT_EQ(write_buffer[i], expected_bytes[i]);
  }
}